

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O2

int uncompress2mem(char *filename,FILE *diskfile,char **buffptr,size_t *buffsize,
                  _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  int iVar4;
  void *__ptr;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong local_b8;
  void *local_a0;
  int local_98;
  char *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  uVar1 = *buffsize;
  uVar7 = 0xffffffff;
  if (uVar1 < 0xffffffff) {
    uVar7 = uVar1;
  }
  iVar4 = *status;
  if (iVar4 < 1) {
    __ptr = malloc(0x1c200);
    if (__ptr == (void *)0x0) {
      *status = 0x71;
      iVar4 = 0x71;
    }
    else {
      local_50 = 0;
      local_60 = 0;
      uStack_58 = 0;
      local_88 = *buffptr;
      local_80 = (undefined4)uVar7;
      iVar4 = inflateInit2_(&local_a0,0x1f,"1.2.11",0x70);
      if (iVar4 == 0) {
        local_b8 = 0;
        do {
          sVar5 = fread(__ptr,1,0x1c200,(FILE *)diskfile);
          iVar4 = ferror((FILE *)diskfile);
          if (iVar4 != 0) {
LAB_001c3488:
            inflateEnd(&local_a0);
            free(__ptr);
            goto LAB_001c349c;
          }
          pvVar3 = __ptr;
          iVar4 = (int)sVar5;
          if ((int)sVar5 == 0) break;
          while ((local_98 = iVar4, local_a0 = pvVar3, iVar4 = inflate(&local_a0,0), iVar4 == -5 ||
                 (iVar4 == 0))) {
            if (local_98 == 0) goto LAB_001c3440;
            if (local_b8 < uVar1 / 0xffffffff) {
              local_b8 = local_b8 + 1;
              local_88 = *buffptr + local_b8 * 0xffffffff;
              local_80 = 0xffffffff;
              pvVar3 = local_a0;
              iVar4 = local_98;
              if (uVar1 / 0xffffffff <= local_b8) {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = *buffsize;
                local_80 = SUB164(auVar2 % ZEXT816(0xffffffff),0);
              }
            }
            else {
              if (mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) goto LAB_001c3488;
              pcVar6 = (char *)(*mem_realloc)(*buffptr,*buffsize + 0x7080);
              *buffptr = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_001c3488;
              local_80 = 0x7080;
              local_88 = pcVar6 + *buffsize;
              *buffsize = *buffsize + 0x7080;
              pvVar3 = local_a0;
              iVar4 = local_98;
            }
          }
          if (iVar4 != 1) goto LAB_001c3488;
LAB_001c3440:
          iVar4 = feof((FILE *)diskfile);
        } while (iVar4 == 0);
        *filesize = local_78;
        free(__ptr);
        iVar4 = inflateEnd(&local_a0);
        if (iVar4 == 0) {
          return *status;
        }
LAB_001c349c:
        *status = 0x19e;
      }
      else {
        *status = 0x19e;
      }
      iVar4 = 0x19e;
    }
  }
  return iVar4;
}

Assistant:

int uncompress2mem(char *filename,  /* name of input file                 */
             FILE *diskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the disk file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err, len;
    char *filebuff;
    z_stream d_stream;   /* decompression stream */
    /* Input args buffptr and buffsize may refer to a block of memory
        larger than the 2^32 4 byte limit.  If so, must be broken
        up into "pages" when assigned to d_stream.  
        (d_stream.avail_out is a uInt type, which might be smaller
        than buffsize's size_t type.)
    */
    const uLong nPages = (uLong)(*buffsize)/(uLong)UINT_MAX;
    uLong iPage=0;
    uInt outbuffsize = (nPages > 0) ? UINT_MAX : (uInt)(*buffsize);
    

    if (*status > 0) 
        return(*status); 

    /* Allocate memory to hold compressed bytes read from the file. */
    filebuff = (char*)malloc(GZBUFSIZE);
    if (!filebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;
    d_stream.next_out = (unsigned char*) *buffptr;
    d_stream.avail_out = outbuffsize;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(filebuff, 1, GZBUFSIZE, diskfile);
	if (ferror(diskfile)) {
              inflateEnd(&d_stream);
              free(filebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)filebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */
                if (!d_stream.avail_in) break; /* need more input */
		
                /* need more space in output buffer */
                /* First check if more memory is available above the
                    4Gb limit in the originally input buffptr array */
                if (iPage < nPages)
                {
                   ++iPage;
                   d_stream.next_out = (unsigned char*)(*buffptr + iPage*(uLong)UINT_MAX);
                   if (iPage < nPages)
                      d_stream.avail_out = UINT_MAX;
                   else
                      d_stream.avail_out = (uInt)((uLong)(*buffsize) % (uLong)UINT_MAX);
                }
                else if (mem_realloc) {   
                    *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                    if (*buffptr == NULL){
                        inflateEnd(&d_stream);
                        free(filebuff);
                        return(*status = 414);  /* memory allocation failed */
                    }

                    d_stream.avail_out = BUFFINCR;
                    d_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                    *buffsize = *buffsize + BUFFINCR;
                } else  { /* error: no realloc function available */
                    inflateEnd(&d_stream);
                    free(filebuff);
                    return(*status = 414);
                }
            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(filebuff);
                return(*status = 414);
            }
        }
	
	if (feof(diskfile))  break;
/*     
        These settings for next_out and avail_out appear to be redundant,
        as the inflate() function should already be re-setting these.
        For case where *buffsize < 4Gb this did not matter, but for
        > 4Gb it would produce the wrong value in the avail_out assignment.
        (C. Gordon Jul 2016)
        d_stream.next_out = (unsigned char*) (*buffptr + d_stream.total_out);
        d_stream.avail_out = *buffsize - d_stream.total_out;
*/    }

    /* Set the output file size to be the total output data */
    *filesize = d_stream.total_out;
    
    free(filebuff); /* free temporary output data buffer */
    
    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}